

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

size_t zt_cstr_len(char *s,ssize_t i,ssize_t j)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  sVar1 = strlen(s);
  if (sVar1 == 0) {
    lVar3 = 0;
  }
  else {
    lVar4 = (i >> 0x3f & sVar1) + i;
    if ((long)sVar1 <= lVar4) {
      lVar4 = sVar1 - 1;
    }
    lVar3 = (j >> 0x3f & sVar1) + j;
    if ((long)sVar1 <= lVar3) {
      lVar3 = sVar1 - 1;
    }
    lVar2 = lVar3;
    if (lVar3 < lVar4) {
      lVar2 = lVar4;
    }
    if (lVar4 < lVar3) {
      lVar3 = lVar4;
    }
    lVar3 = lVar3 - lVar2;
  }
  lVar4 = -lVar3;
  if (0 < lVar3) {
    lVar4 = lVar3;
  }
  return lVar4 + 1;
}

Assistant:

size_t
zt_cstr_len(const char *s, ssize_t i, ssize_t j) {
    CONVERT(s, i, j);
    return IDXLEN(i, j);
}